

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1cod.c
# Opt level: O2

int JPC_ISTERMINATED(int passno,int firstpassno,int numpasses,int termall,int lazy)

{
  int iVar1;
  
  if (passno - firstpassno == numpasses + -1) {
    return 1;
  }
  iVar1 = JPC_SEGPASSCNT(passno,firstpassno,numpasses,lazy,termall);
  return (uint)(iVar1 < 2);
}

Assistant:

int JPC_ISTERMINATED(int passno, int firstpassno, int numpasses, int termall,
  int lazy)
{
	int ret;
	int n;
	if (passno - firstpassno == numpasses - 1) {
		ret = 1;
	} else {
		n = JPC_SEGPASSCNT(passno, firstpassno, numpasses, lazy, termall);
		ret = (n <= 1) ? 1 : 0;
	}

	return ret;
}